

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
          (SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
           *this)

{
  SDLGraphicsSystemWithLoadedTexture::SDLGraphicsSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  (this->super_SDLGraphicsSystemWithLoadedTexture).super_SDLGraphicsSystemWithCreatedWindowTests.
  super_SDLGraphicsSystemTests.super_Test._vptr_Test =
       (_func_int **)&PTR__SDLGraphicsSystemTests_002f8b70;
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   Eq(std::nullopt), Eq(std::nullopt))
    ).WillOnce(Return(failure));

    EXPECT_THROW(system.renderTextureInFullWindow(textureId0), std::runtime_error);
    expectQuitSystemWithLoadedTexture();
}